

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

color * __thiscall
camera::ray_color(color *__return_storage_ptr__,camera *this,ray *r,int depth,hittable *world,
                 hittable *lights)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  char cVar4;
  int iVar5;
  color sample_color;
  shared_ptr<hittable_pdf> light_ptr;
  color color_from_emission;
  scatter_record srec;
  mixture_pdf p;
  ray scattered;
  hit_record rec;
  vec3 local_1f8;
  double local_1e0;
  __shared_ptr<hittable_pdf,_(__gnu_cxx::_Lock_policy)2> local_1d8;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  __shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  shared_ptr<pdf> local_198;
  double local_188;
  double dStack_180;
  double local_178;
  __shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2> _Stack_170;
  char local_160;
  ray local_158;
  undefined8 local_118;
  mixture_pdf local_100;
  ray local_d8;
  double local_98;
  double dStack_90;
  double local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  undefined4 local_50;
  undefined4 local_48;
  
  if (depth < 1) {
    __return_storage_ptr__->e[0] = 0.0;
    __return_storage_ptr__->e[1] = 0.0;
    __return_storage_ptr__->e[2] = 0.0;
  }
  else {
    local_68 = (long *)0x0;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0.0;
    uStack_80 = 0;
    local_98 = 0.0;
    dStack_90 = 0.0;
    iVar5 = (*world->_vptr_hittable[2])(0xd2f1a9fc,0,world,r);
    if ((char)iVar5 == '\0') {
      __return_storage_ptr__->e[2] = (this->background).e[2];
      dVar3 = (this->background).e[1];
      __return_storage_ptr__->e[0] = (this->background).e[0];
      __return_storage_ptr__->e[1] = dVar3;
    }
    else {
      local_158.dir.e[1] = 0.0;
      local_158.dir.e[2] = 0.0;
      local_158.orig.e[2] = 0.0;
      local_158.dir.e[0] = 0.0;
      local_158.orig.e[0] = 0.0;
      local_158.orig.e[1] = 0.0;
      local_188 = 0.0;
      dStack_180 = 0.0;
      local_178 = 0.0;
      _Stack_170._M_ptr = (element_type *)0x0;
      _Stack_170._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (**(code **)(*local_68 + 0x10))(local_50,local_48,&local_1c8,local_68,r,&local_98,&local_98);
      cVar4 = (**(code **)(*local_68 + 0x18))(local_68,r,&local_98,&local_188);
      if (cVar4 == '\0') {
        __return_storage_ptr__->e[2] = local_1b8;
        __return_storage_ptr__->e[0] = local_1c8;
        __return_storage_ptr__->e[1] = dStack_1c0;
      }
      else if (local_160 == '\x01') {
        ray_color(&local_d8.orig,this,&local_158,depth + -1,world,lights);
        auVar1._8_4_ = SUB84(dStack_180 * local_d8.orig.e[1],0);
        auVar1._0_8_ = local_188 * local_d8.orig.e[0];
        auVar1._12_4_ = (int)((ulong)(dStack_180 * local_d8.orig.e[1]) >> 0x20);
        *(undefined1 (*) [16])__return_storage_ptr__->e = auVar1;
        __return_storage_ptr__->e[2] = local_178 * local_d8.orig.e[2];
      }
      else {
        std::make_shared<hittable_pdf,hittable_const&,vec3&>((hittable *)&local_1d8,(vec3 *)lights);
        std::__shared_ptr<pdf,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<hittable_pdf,void>
                  ((__shared_ptr<pdf,(__gnu_cxx::_Lock_policy)2> *)&local_198,&local_1d8);
        std::__shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_1a8,&_Stack_170);
        mixture_pdf::mixture_pdf(&local_100,&local_198,(shared_ptr<pdf> *)&local_1a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_198.super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        mixture_pdf::generate(&local_1f8,&local_100);
        local_d8.tm = r->tm;
        local_d8.orig.e[2] = local_88;
        local_d8.orig.e[0] = local_98;
        local_d8.orig.e[1] = dStack_90;
        local_d8.dir.e[0] = local_1f8.e[0];
        local_d8.dir.e[1] = local_1f8.e[1];
        local_d8.dir.e[2] = local_1f8.e[2];
        local_1e0 = mixture_pdf::value(&local_100,&local_d8.dir);
        local_118 = (double)(**(code **)(*local_68 + 0x20))(local_68,r,&local_98,&local_d8);
        ray_color(&local_1f8,this,&local_d8,depth + -1,world,lights);
        dVar3 = 1.0 / local_1e0;
        dStack_1c0 = dVar3 * local_118 * dStack_180 * local_1f8.e[1] + dStack_1c0;
        auVar2._8_4_ = SUB84(dStack_1c0,0);
        auVar2._0_8_ = dVar3 * local_118 * local_188 * local_1f8.e[0] + local_1c8;
        auVar2._12_4_ = (int)((ulong)dStack_1c0 >> 0x20);
        *(undefined1 (*) [16])__return_storage_ptr__->e = auVar2;
        __return_storage_ptr__->e[2] = local_178 * local_118 * local_1f8.e[2] * dVar3 + local_1b8;
        mixture_pdf::~mixture_pdf(&local_100);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d8._M_refcount);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_170._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_60);
  }
  return __return_storage_ptr__;
}

Assistant:

color ray_color(const ray& r, int depth, const hittable& world, const hittable& lights)
    const {
        // If we've exceeded the ray bounce limit, no more light is gathered.
        if (depth <= 0)
            return color(0,0,0);

        hit_record rec;

        // If the ray hits nothing, return the background color.
        if (!world.hit(r, interval(0.001, infinity), rec))
            return background;

        scatter_record srec;
        color color_from_emission = rec.mat->emitted(r, rec, rec.u, rec.v, rec.p);

        if (!rec.mat->scatter(r, rec, srec))
            return color_from_emission;

        if (srec.skip_pdf) {
            return srec.attenuation * ray_color(srec.skip_pdf_ray, depth-1, world, lights);
        }

        auto light_ptr = make_shared<hittable_pdf>(lights, rec.p);
        mixture_pdf p(light_ptr, srec.pdf_ptr);

        ray scattered = ray(rec.p, p.generate(), r.time());
        auto pdf_value = p.value(scattered.direction());

        double scattering_pdf = rec.mat->scattering_pdf(r, rec, scattered);

        color sample_color = ray_color(scattered, depth-1, world, lights);
        color color_from_scatter =
            (srec.attenuation * scattering_pdf * sample_color) / pdf_value;

        return color_from_emission + color_from_scatter;
    }